

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SetString(char **pz,sqlite3 *db,char *zFormat,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 *in_RDI;
  __va_list_tag *in_XMM4_Qb;
  char *in_XMM5_Qa;
  sqlite3 *in_XMM5_Qb;
  char *z;
  va_list ap;
  void *in_stack_ffffffffffffff08;
  sqlite3 *in_stack_ffffffffffffff10;
  __va_list_tag *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  sqlite3 *in_stack_ffffffffffffff90;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff80 = in_XMM4_Qb;
    in_stack_ffffffffffffff88 = in_XMM5_Qa;
    in_stack_ffffffffffffff90 = in_XMM5_Qb;
  }
  pcVar1 = sqlite3VMPrintf(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff80);
  sqlite3DbFree(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  *in_RDI = pcVar1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SetString(char **pz, sqlite3 *db, const char *zFormat, ...){
  va_list ap;
  char *z;

  va_start(ap, zFormat);
  z = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  sqlite3DbFree(db, *pz);
  *pz = z;
}